

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentence_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::SentenceTests_ReadAlignedSentencePair_Test::TestBody
          (SentenceTests_ReadAlignedSentencePair_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_RCX;
  string_view line_00;
  AssertHelper local_120;
  Message local_118;
  size_type local_110;
  int local_104;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_2;
  Message local_e8;
  size_type local_e0;
  int local_d4;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_b8;
  Message local_b0 [3];
  size_type local_98;
  int local_8c;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  undefined1 local_68 [8];
  AlignedSentencePair pair;
  string_view line;
  SentenceTests_ReadAlignedSentencePair_Test *this_local;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             &pair.alignment.
              super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,"foo bar baz\tqux\t0-0 1-0 2-0");
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       pair.alignment.super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  line_00._M_str = in_RCX;
  line_00._M_len = line._M_len;
  readAlignedSentencePair<false,false>
            ((AlignedSentencePair *)local_68,
             (thrax *)pair.alignment.
                      super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,line_00);
  local_8c = 3;
  local_98 = std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)local_68);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_88,"3","pair.src.size()",&local_8c,&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/sentence_test.cpp"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b8,local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message(local_b0);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_d4 = 1;
    local_e0 = std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::size((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)&pair.src.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::internal::EqHelper<false>::Compare<int,unsigned_long>
              ((EqHelper<false> *)local_d0,"1","pair.tgt.size()",&local_d4,&local_e0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
    if (!bVar1) {
      testing::Message::Message(&local_e8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/sentence_test.cpp"
                 ,0x42,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_e8);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      local_104 = 3;
      local_110 = std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::size
                            ((vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_> *)
                             &pair.tgt.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      testing::internal::EqHelper<false>::Compare<int,unsigned_long>
                ((EqHelper<false> *)local_100,"3","pair.alignment.size()",&local_104,&local_110);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
      if (!bVar1) {
        testing::Message::Message(&local_118);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
        testing::internal::AssertHelper::AssertHelper
                  (&local_120,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/sentence_test.cpp"
                   ,0x43,pcVar2);
        testing::internal::AssertHelper::operator=(&local_120,&local_118);
        testing::internal::AssertHelper::~AssertHelper(&local_120);
        testing::Message::~Message(&local_118);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        gtest_ar_1.message_.ptr_._4_4_ = 0;
      }
    }
  }
  AlignedSentencePair::~AlignedSentencePair((AlignedSentencePair *)local_68);
  return;
}

Assistant:

TEST(SentenceTests, ReadAlignedSentencePair) {
  std::string_view line = "foo bar baz\tqux\t0-0 1-0 2-0";
  auto pair = readAlignedSentencePair<false, false>(line);
  ASSERT_EQ(3, pair.src.size());
  ASSERT_EQ(1, pair.tgt.size());
  ASSERT_EQ(3, pair.alignment.size());
}